

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

mp_limb_t mpn_div_qr_1_preinv(mp_ptr qp,mp_srcptr np,mp_size_t nn,gmp_div_inverse *inv)

{
  ulong uVar1;
  mp_ptr rp;
  mp_limb_t mVar2;
  ulong uVar3;
  ulong uVar4;
  mp_limb_t __u;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  if (inv->shift == 0) {
    rp = (mp_ptr)0x0;
    mVar2 = 0;
  }
  else {
    rp = (mp_ptr)(*gmp_allocate_func)(nn * 8);
    mVar2 = mpn_lshift(rp,np,nn,inv->shift);
    np = rp;
  }
  if (0 < nn) {
    uVar1 = inv->d1;
    uVar3 = inv->di & 0xffffffff;
    uVar4 = inv->di >> 0x20;
    lVar11 = nn + 1;
    do {
      uVar9 = (mVar2 & 0xffffffff) * uVar3;
      uVar10 = (mVar2 >> 0x20) * uVar3;
      lVar8 = (mVar2 >> 0x20) * uVar4;
      uVar5 = (mVar2 & 0xffffffff) * uVar4 + uVar10 + (uVar9 >> 0x20);
      lVar6 = lVar8 + 0x100000000;
      if (uVar10 <= uVar5) {
        lVar6 = lVar8;
      }
      uVar10 = uVar9 & 0xffffffff | uVar5 << 0x20;
      uVar9 = np[lVar11 + -2];
      uVar7 = uVar10 + uVar9;
      lVar6 = mVar2 + 1 + (uVar5 >> 0x20) + lVar6 + (ulong)CARRY8(uVar10,uVar9);
      uVar9 = uVar9 - lVar6 * uVar1;
      uVar5 = 0;
      if (uVar7 < uVar9) {
        uVar5 = uVar1;
      }
      uVar5 = uVar5 + uVar9;
      uVar10 = 0;
      if (uVar1 <= uVar5) {
        uVar10 = uVar1;
      }
      if (qp != (mp_ptr)0x0) {
        qp[lVar11 + -2] = ((lVar6 - (ulong)(uVar7 < uVar9)) + 1) - (ulong)(uVar5 < uVar1);
      }
      mVar2 = uVar5 - uVar10;
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  if (inv->shift != 0) {
    (*gmp_free_func)(rp,0);
  }
  return mVar2 >> ((byte)inv->shift & 0x3f);
}

Assistant:

static mp_limb_t
mpn_div_qr_1_preinv (mp_ptr qp, mp_srcptr np, mp_size_t nn,
		     const struct gmp_div_inverse *inv)
{
  mp_limb_t d, di;
  mp_limb_t r;
  mp_ptr tp = NULL;

  if (inv->shift > 0)
    {
      tp = gmp_xalloc_limbs (nn);
      r = mpn_lshift (tp, np, nn, inv->shift);
      np = tp;
    }
  else
    r = 0;

  d = inv->d1;
  di = inv->di;
  while (--nn >= 0)
    {
      mp_limb_t q;

      gmp_udiv_qrnnd_preinv (q, r, r, np[nn], d, di);
      if (qp)
	qp[nn] = q;
    }
  if (inv->shift > 0)
    gmp_free (tp);

  return r >> inv->shift;
}